

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O1

void ClearRectangle(WebPPicture *picture,int left,int top,int width,int height)

{
  uint32_t *puVar1;
  int iVar2;
  int j;
  int iVar3;
  
  if (0 < height) {
    iVar3 = height + top;
    puVar1 = picture->argb;
    iVar2 = left + 1;
    if (left + 1 < width + left) {
      iVar2 = width + left;
    }
    do {
      if (0 < width) {
        memset(puVar1 + (long)left + (long)(picture->argb_stride * top),0,
               (ulong)(uint)(~left + iVar2) * 4 + 4);
      }
      top = top + 1;
    } while (top < iVar3);
  }
  return;
}

Assistant:

static void ClearRectangle(WebPPicture* const picture,
                           int left, int top, int width, int height) {
  int j;
  for (j = top; j < top + height; ++j) {
    uint32_t* const dst = picture->argb + j * picture->argb_stride;
    int i;
    for (i = left; i < left + width; ++i) {
      dst[i] = TRANSPARENT_COLOR;
    }
  }
}